

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O0

int Saig_ManCexFirstFlopPi(Aig_Man_t *p,Aig_Man_t *pAbs)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAbs_local;
  Aig_Man_t *p_local;
  
  if (pAbs->vCiNumsOrig == (Vec_Int_t *)0x0) {
    __assert_fail("pAbs->vCiNumsOrig != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldRef.c"
                  ,0x8a,"int Saig_ManCexFirstFlopPi(Aig_Man_t *, Aig_Man_t *)");
  }
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vCis);
    if (iVar1 <= local_2c) {
      return -1;
    }
    Vec_PtrEntry(p->vCis,local_2c);
    iVar1 = Vec_IntEntry(pAbs->vCiNumsOrig,local_2c);
    iVar2 = Saig_ManPiNum(p);
    if (iVar2 <= iVar1) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int Saig_ManCexFirstFlopPi( Aig_Man_t * p, Aig_Man_t * pAbs )
{ 
    Aig_Obj_t * pObj;
    int i;
    assert( pAbs->vCiNumsOrig != NULL );
    Aig_ManForEachCi( p, pObj, i )
    {
        if ( Vec_IntEntry(pAbs->vCiNumsOrig, i) >= Saig_ManPiNum(p) )
            return i;
    }
    return -1;
}